

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

int qMetaTypeId<QFlags<Qt::AlignmentFlag>>(void)

{
  long lVar1;
  int iVar2;
  QMetaType this;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = QMetaType::fromType<QFlags<Qt::AlignmentFlag>>();
  iVar2 = QMetaType::id((QMetaType *)this.d_ptr,in_stack_ffffffffffffffec);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

inline constexpr int qMetaTypeId()
{
    if constexpr (bool(QMetaTypeId2<T>::IsBuiltIn)) {
        // this has the same result as the below code, but avoids asking the
        // compiler to load a global variable whose value we know at compile
        // time
        return QMetaTypeId2<T>::MetaType;
    } else {
        return QMetaType::fromType<T>().id();
    }
}